

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O3

void __thiscall
QtMWidgets::Section::fillValues
          (Section *this,QDateTime *current,QDateTime *min,QDateTime *max,bool updateIndex)

{
  QVector<QString> *this_00;
  Type TVar1;
  qsizetype qVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  char16_t *pcVar9;
  undefined3 in_register_00000081;
  int i;
  uint uVar10;
  uint uVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QString v;
  QDate date;
  QString local_88;
  QString local_68;
  QDateTime *local_50;
  uint local_48;
  uint local_44;
  QDate local_40;
  QLocale local_38 [8];
  
  uVar8 = CONCAT31(in_register_00000081,updateIndex);
  this_00 = &this->values;
  local_50 = current;
  QList<QString>::clear(this_00);
  if (uVar8 != 0) {
    this->currentIndex = -1;
  }
  TVar1 = this->type;
  iVar4 = (int)&local_88;
  local_48 = uVar8;
  if ((int)TVar1 < 0x80) {
    if ((int)TVar1 < 0x10) {
      switch(TVar1) {
      case AmPmSection:
        QVar12.m_data = (storage_type *)0x2;
        QVar12.m_size = (qsizetype)&local_88;
        QString::fromLatin1(QVar12);
        local_68.d.ptr = local_88.d.ptr;
        local_68.d.d = local_88.d.d;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_68.d.size = local_88.d.size;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        QVar13.m_data = (storage_type *)0x2;
        QVar13.m_size = (qsizetype)&local_88;
        QString::fromLatin1(QVar13);
        local_68.d.ptr = local_88.d.ptr;
        local_68.d.d = local_88.d.d;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_68.d.size = local_88.d.size;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar7 = QDateTime::time();
        local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
        iVar4 = QTime::hour();
        if (iVar4 < 0xc) {
          this->currentIndex = 0;
        }
        else {
          this->currentIndex = 1;
        }
        break;
      case SecondSection:
        uVar7 = QDateTime::time();
        local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
        uVar8 = QTime::second();
        uVar11 = 0;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar11 < 10) && (this->zeroesAdded != false)) {
            QVar18.m_data = (char *)0x1;
            QVar18.m_size = (qsizetype)&local_68;
            QString::append(QVar18);
          }
          QString::number(iVar4,uVar11);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          qVar2 = (this->values).d.size;
          if (uVar8 == uVar11) {
            this->currentIndex = (int)qVar2;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x3c);
        break;
      case MinuteSection:
        uVar7 = QDateTime::time();
        local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
        uVar8 = QTime::minute();
        uVar11 = 0;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar11 < 10) && (this->zeroesAdded != false)) {
            QVar17.m_data = (char *)0x1;
            QVar17.m_size = (qsizetype)&local_68;
            QString::append(QVar17);
          }
          QString::number(iVar4,uVar11);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          qVar2 = (this->values).d.size;
          if (uVar8 == uVar11) {
            this->currentIndex = (int)qVar2;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x3c);
        break;
      case Hour12Section:
        uVar7 = QDateTime::time();
        local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
        uVar11 = QTime::hour();
        uVar8 = uVar11 - 0xc;
        if ((int)uVar11 < 0xd) {
          uVar8 = uVar11;
        }
        uVar10 = 0xc;
        if (uVar11 != 0) {
          uVar10 = uVar8;
        }
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar16.m_data = (char *)0x1;
            QVar16.m_size = (qsizetype)&local_68;
            QString::append(QVar16);
          }
          QString::number(iVar4,uVar8);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          qVar2 = (this->values).d.size;
          if (uVar10 == uVar8) {
            this->currentIndex = (int)qVar2;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0xd);
      }
    }
    else if (TVar1 == Hour24Section) {
      uVar7 = QDateTime::time();
      local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
      uVar8 = QTime::hour();
      uVar11 = 0;
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar11 < 10) && (this->zeroesAdded != false)) {
          QVar19.m_data = (char *)0x1;
          QVar19.m_size = (qsizetype)&local_68;
          QString::append(QVar19);
        }
        QString::number(iVar4,uVar11);
        QString::append(&local_68);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        qVar2 = (this->values).d.size;
        if (uVar8 == uVar11) {
          this->currentIndex = (int)qVar2;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x18);
    }
    else if (TVar1 == DaySection) {
      local_88.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar20.m_data = (char *)0x1;
            QVar20.m_size = (qsizetype)&local_68;
            QString::append(QVar20);
          }
          QString::number(iVar4,uVar8);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          qVar2 = (this->values).d.size;
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)qVar2;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_88.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar3 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar3);
      }
    }
    else if (TVar1 == DaySectionShort) {
      local_88.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::year();
      local_68.d.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      QDate::QDate(&local_40,iVar5,iVar6,1);
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar14.m_data = (char *)0x1;
            QVar14.m_size = (qsizetype)&local_68;
            QString::append(QVar14);
          }
          QString::number(iVar4,uVar8);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)(this->values).d.size;
          }
          QString::insert((longlong)&local_68,(QChar)0x0);
          QLocale::system();
          QDate::dayOfWeek();
          QLocale::dayName(iVar4,(FormatType)local_38);
          pcVar9 = local_88.d.ptr;
          if (local_88.d.ptr == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          QString::insert((longlong)&local_68,(QChar *)0x0,(longlong)pcVar9);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          QLocale::~QLocale(local_38);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          local_40.jd = QDate::addDays((longlong)&local_40);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_88.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar3 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar3);
      }
    }
  }
  else if ((int)TVar1 < 0x400) {
    if (TVar1 == DaySectionLong) {
      local_88.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::year();
      local_68.d.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      QDate::QDate(&local_40,iVar5,iVar6,1);
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar21.m_data = (char *)0x1;
            QVar21.m_size = (qsizetype)&local_68;
            QString::append(QVar21);
          }
          QString::number(iVar4,uVar8);
          QString::append(&local_68);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)(this->values).d.size;
          }
          QString::insert((longlong)&local_68,(QChar)0x0);
          QLocale::system();
          QDate::dayOfWeek();
          QLocale::dayName(iVar4,(FormatType)local_38);
          pcVar9 = local_88.d.ptr;
          if (local_88.d.ptr == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          QString::insert((longlong)&local_68,(QChar *)0x0,(longlong)pcVar9);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
            }
          }
          QLocale::~QLocale(local_38);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          local_40.jd = QDate::addDays((longlong)&local_40);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_88.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar3 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar3);
      }
    }
    else if (TVar1 == MonthSection) {
      local_88.d.d = (Data *)QDateTime::date();
      uVar8 = QDate::month();
      uVar11 = 1;
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar11 < 10) && (this->zeroesAdded != false)) {
          QVar22.m_data = (char *)0x1;
          QVar22.m_size = (qsizetype)&local_68;
          QString::append(QVar22);
        }
        QString::number(iVar4,uVar11);
        QString::append(&local_68);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        qVar2 = (this->values).d.size;
        if (uVar8 == uVar11) {
          this->currentIndex = (int)qVar2;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xd);
    }
    else if (TVar1 == MonthSectionShort) {
      local_88.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::month();
      iVar6 = 1;
      do {
        if (iVar5 == iVar6) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QLocale::system();
        QLocale::monthName(iVar4,(FormatType)(QLocale *)&local_68);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_88);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        QLocale::~QLocale((QLocale *)&local_68);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
    }
  }
  else if (TVar1 == MonthSectionLong) {
    local_88.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::month();
    iVar6 = 1;
    do {
      if (iVar5 == iVar6) {
        this->currentIndex = (int)(this->values).d.size;
      }
      QLocale::system();
      QLocale::monthName(iVar4,(FormatType)(QLocale *)&local_68);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      QLocale::~QLocale((QLocale *)&local_68);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
  }
  else if (TVar1 == YearSection) {
    local_88.d.d = (Data *)QDateTime::date();
    uVar8 = QDate::year();
    local_88.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::year();
    local_88.d.d = (Data *)QDateTime::date();
    uVar7 = QDate::year();
    local_50 = (QDateTime *)CONCAT44(local_50._4_4_,uVar7);
    if ((int)uVar8 <= iVar5) {
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar8 < 10) && (this->zeroesAdded != false)) {
          QVar23.m_data = (char *)0x1;
          QVar23.m_size = (qsizetype)&local_68;
          QString::append(QVar23);
        }
        QString::number(iVar4,uVar8);
        QString::append(&local_68);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        qVar2 = (this->values).d.size;
        if ((uint)local_50 == uVar8) {
          this->currentIndex = (int)qVar2;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,qVar2,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar8 = uVar8 + 1;
      } while (iVar5 + 1U != uVar8);
    }
  }
  else if (TVar1 == YearSection2Digits) {
    local_88.d.d = (Data *)QDateTime::date();
    uVar8 = QDate::year();
    local_88.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::year();
    local_88.d.d = (Data *)QDateTime::date();
    uVar7 = QDate::year();
    local_50 = (QDateTime *)CONCAT44(local_50._4_4_,uVar7);
    if ((int)uVar8 <= iVar5) {
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar8 < 10) && (this->zeroesAdded != false)) {
          QVar15.m_data = (char *)0x1;
          QVar15.m_size = (qsizetype)&local_68;
          QString::append(QVar15);
        }
        QString::number(iVar4,uVar8);
        QString::append(&local_68);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        if ((uint)local_50 == uVar8) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QString::right((longlong)&local_88);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_88);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar8 = uVar8 + 1;
      } while (iVar5 + 1U != uVar8);
    }
  }
  return;
}

Assistant:

void
Section::fillValues( const QDateTime & current,
	const QDateTime & min, const QDateTime & max,
	bool updateIndex )
{
	values.clear();

	if( updateIndex )
		currentIndex = -1;

	switch( type )
	{
		case AmPmSection :
		{
			values.append( QLatin1String( "AM" ) );
			values.append( QLatin1String( "PM" ) );

			if( current.time().hour() >= 12 )
				currentIndex = 1;
			else
				currentIndex = 0;
		}
		break;

		case SecondSection :
		{
			const int s = current.time().second();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( s == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MinuteSection :
		{
			const int m = current.time().minute();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour12Section :
		{
			int h = 0;
			int currentHour = current.time().hour();

			if( currentHour == 0 )
				h = 12;
			else if( currentHour > 12 )
				h = currentHour - 12;
			else
				h = currentHour;

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour24Section :
		{
			const int h = current.time().hour();

			for( int i = 0; i < 24; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySection :
		{
			const int d = current.date().day();

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySectionShort :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek(), QLocale::ShortFormat ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case DaySectionLong :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek() ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case MonthSection :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MonthSectionShort :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i, QLocale::ShortFormat ) );
			}
		}
		break;

		case MonthSectionLong :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i ) );
			}
		}
		break;

		case YearSection :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v );

				++start;
			}
		}
		break;

		case YearSection2Digits :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v.right( 2 ) );

				++start;
			}
		}
		break;

		default:
			break;
	}
}